

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_script.c
# Opt level: O0

void ngx_http_script_copy_code(ngx_http_script_engine_t *e)

{
  u_char *puVar1;
  u_char *__dest;
  ngx_http_script_copy_code_t *code;
  u_char *p;
  ngx_http_script_engine_t *e_local;
  
  puVar1 = e->ip;
  __dest = e->pos;
  if (((byte)e->field_0x40 >> 1 & 1) == 0) {
    memcpy(__dest,e->ip + 0x10,*(size_t *)(puVar1 + 8));
    e->pos = __dest + *(long *)(puVar1 + 8);
  }
  e->ip = e->ip + (*(long *)(puVar1 + 8) + 7U & 0xfffffffffffffff8) + 0x10;
  if ((e->request->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,e->request->connection->log,0,"http script copy: \"%*s\"",
                       (long)e->pos - (long)__dest,__dest);
  }
  return;
}

Assistant:

void
ngx_http_script_copy_code(ngx_http_script_engine_t *e)
{
    u_char                       *p;
    ngx_http_script_copy_code_t  *code;

    code = (ngx_http_script_copy_code_t *) e->ip;

    p = e->pos;

    if (!e->skip) {
        e->pos = ngx_copy(p, e->ip + sizeof(ngx_http_script_copy_code_t),
                          code->len);
    }

    e->ip += sizeof(ngx_http_script_copy_code_t)
          + ((code->len + sizeof(uintptr_t) - 1) & ~(sizeof(uintptr_t) - 1));

    ngx_log_debug2(NGX_LOG_DEBUG_HTTP, e->request->connection->log, 0,
                   "http script copy: \"%*s\"", e->pos - p, p);
}